

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_property_variant *
nk_property_variant_int
          (nk_property_variant *__return_storage_ptr__,int value,int min_value,int max_value,
          int step)

{
  int step_local;
  int max_value_local;
  int min_value_local;
  int value_local;
  
  __return_storage_ptr__->kind = NK_PROPERTY_INT;
  (__return_storage_ptr__->value).i = value;
  (__return_storage_ptr__->min_value).i = min_value;
  (__return_storage_ptr__->max_value).i = max_value;
  (__return_storage_ptr__->step).i = step;
  return __return_storage_ptr__;
}

Assistant:

NK_LIB struct nk_property_variant
nk_property_variant_int(int value, int min_value, int max_value, int step)
{
    struct nk_property_variant result;
    result.kind = NK_PROPERTY_INT;
    result.value.i = value;
    result.min_value.i = min_value;
    result.max_value.i = max_value;
    result.step.i = step;
    return result;
}